

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Tbc::Text::~Text(Text *this)

{
  Text *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->lines);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Text(std::string const& _str, TextAttributes const& _attr = TextAttributes())
				: attr(_attr)
			{
				std::string wrappableChars = " [({.,/|\\-";
				std::size_t indent = _attr.initialIndent != std::string::npos
					? _attr.initialIndent
					: _attr.indent;
				std::string remainder = _str;

				while (!remainder.empty()) {
					if (lines.size() >= 1000) {
						lines.push_back("... message truncated due to excessive size");
						return;
					}
					std::size_t tabPos = std::string::npos;
					std::size_t width = (std::min)(remainder.size(), _attr.width - indent);
					std::size_t pos = remainder.find_first_of('\n');
					if (pos <= width) {
						width = pos;
					}
					pos = remainder.find_last_of(_attr.tabChar, width);
					if (pos != std::string::npos) {
						tabPos = pos;
						if (remainder[width] == '\n')
							width--;
						remainder = remainder.substr(0, tabPos) + remainder.substr(tabPos + 1);
					}

					if (width == remainder.size()) {
						spliceLine(indent, remainder, width);
					}
					else if (remainder[width] == '\n') {
						spliceLine(indent, remainder, width);
						if (width <= 1 || remainder.size() != 1)
							remainder = remainder.substr(1);
						indent = _attr.indent;
					}
					else {
						pos = remainder.find_last_of(wrappableChars, width);
						if (pos != std::string::npos && pos > 0) {
							spliceLine(indent, remainder, pos);
							if (remainder[0] == ' ')
								remainder = remainder.substr(1);
						}
						else {
							spliceLine(indent, remainder, width - 1);
							lines.back() += "-";
						}
						if (lines.size() == 1)
							indent = _attr.indent;
						if (tabPos != std::string::npos)
							indent += tabPos;
					}
				}
			}